

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

Value * __thiscall camp::Args::operator[](Args *this,size_t index)

{
  pointer pVVar1;
  OutOfRange *__return_storage_ptr__;
  ulong uVar2;
  string local_b0;
  string local_90;
  OutOfRange local_70;
  
  pVVar1 = (this->m_values).super__Vector_base<camp::Value,_std::allocator<camp::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->m_values).super__Vector_base<camp::Value,_std::allocator<camp::Value>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3) * 0x6db6db6db6db6db7
  ;
  if (index <= uVar2 && uVar2 - index != 0) {
    return pVVar1 + index;
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange
            (&local_70,index,
             ((long)(this->m_values).super__Vector_base<camp::Value,_std::allocator<camp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_values).super__Vector_base<camp::Value,_std::allocator<camp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/args.cpp"
             ,"");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"const Value &camp::Args::operator[](std::size_t) const","");
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_70,&local_90,0x60,&local_b0);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

const Value& Args::operator[](std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_values.size())
        CAMP_ERROR(OutOfRange(index, m_values.size()));

    return m_values[index];
}